

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void ifftrecurs(float *ioptr,long M,float *Utbl,long Ustride,long NDiffU,long StageCnt)

{
  ulong M_00;
  long lVar1;
  
  if (0xb < (ulong)M) {
    M_00 = M - 3;
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      ifftrecurs(ioptr + (lVar1 << (M_00 & 0x3f)) * 2,M_00,Utbl,Ustride * 8,NDiffU,StageCnt + -1);
    }
    StageCnt = 1;
    NDiffU = 1L << (M_00 & 0x3f);
  }
  ibfstages(ioptr,M,Utbl,Ustride,NDiffU,StageCnt);
  return;
}

Assistant:

void ifftrecurs(float *ioptr, long M, float *Utbl, long Ustride, long NDiffU, long StageCnt){
/* recursive bfstages calls to maximize on chip cache efficiency */
long i1;
if (M <= MCACHE)
	ibfstages(ioptr, M, Utbl, Ustride, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
else{
	for (i1=0; i1<8; i1++){
		ifftrecurs(&ioptr[i1*POW2(M-3)*2], M-3, Utbl, 8*Ustride, NDiffU, StageCnt-1);	/*  RADIX 8 Stages	*/
	}
	ibfstages(ioptr, M, Utbl, Ustride, POW2(M-3), 1);	/*  RADIX 8 Stage	*/
}
}